

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

void secp256k1_scalar_reduce_512(secp256k1_scalar *r,uint64_t *l)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  uint64_t c;
  uint64_t p4;
  uint64_t p3;
  uint64_t p2;
  uint64_t p1;
  uint64_t p0;
  uint64_t m6;
  uint64_t m5;
  uint64_t m4;
  uint64_t m3;
  uint64_t m2;
  uint64_t m1;
  uint64_t m0;
  uint local_90;
  
  uVar25 = l[4];
  uVar35 = l[5];
  uVar40 = l[6];
  uVar41 = l[7];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *l;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar25;
  auVar17 = ZEXT816(0x402da1732fc9bebf) * auVar1 + auVar17;
  uVar31 = auVar17._8_8_;
  uVar32 = uVar31 + l[1];
  uVar31 = (ulong)CARRY8(uVar31,l[1]);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar35;
  uVar26 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar2,8);
  uVar24 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar2,0);
  uVar33 = uVar32 + uVar24;
  uVar24 = (ulong)CARRY8(uVar32,uVar24);
  uVar30 = uVar31 + uVar26;
  uVar36 = uVar30 + uVar24;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar25;
  uVar27 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar3,8);
  uVar32 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar3,0);
  uVar34 = uVar33 + uVar32;
  uVar32 = (ulong)CARRY8(uVar33,uVar32);
  uVar33 = uVar36 + uVar27;
  uVar37 = uVar33 + uVar32;
  uVar36 = (ulong)(CARRY8(uVar31,uVar26) || CARRY8(uVar30,uVar24)) +
           (ulong)(CARRY8(uVar36,uVar27) || CARRY8(uVar33,uVar32));
  uVar32 = uVar37 + l[2];
  uVar31 = (ulong)CARRY8(uVar37,l[2]);
  uVar37 = uVar36 + uVar31;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar40;
  uVar26 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar4,8);
  uVar24 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar4,0);
  uVar33 = uVar32 + uVar24;
  uVar24 = (ulong)CARRY8(uVar32,uVar24);
  uVar30 = uVar37 + uVar26;
  uVar28 = uVar30 + uVar24;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar35;
  uVar27 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar5,8);
  uVar32 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar5,0);
  uVar38 = uVar33 + uVar32;
  uVar32 = (ulong)CARRY8(uVar33,uVar32);
  uVar33 = uVar28 + uVar27;
  uVar29 = uVar33 + uVar32;
  uVar39 = uVar38 + uVar25;
  uVar25 = (ulong)CARRY8(uVar38,uVar25);
  uVar38 = uVar29 + uVar25;
  uVar37 = (ulong)CARRY8(uVar36,uVar31) + (ulong)(CARRY8(uVar37,uVar26) || CARRY8(uVar30,uVar24)) +
           (ulong)(CARRY8(uVar28,uVar27) || CARRY8(uVar33,uVar32)) + (ulong)CARRY8(uVar29,uVar25);
  uVar24 = uVar38 + l[3];
  uVar25 = (ulong)CARRY8(uVar38,l[3]);
  uVar28 = uVar37 + uVar25;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar41;
  uVar33 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar6,8);
  uVar31 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar6,0);
  uVar30 = uVar24 + uVar31;
  uVar31 = (ulong)CARRY8(uVar24,uVar31);
  uVar32 = uVar28 + uVar33;
  uVar29 = uVar32 + uVar31;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar40;
  uVar26 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar7,8);
  uVar24 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar7,0);
  uVar27 = uVar30 + uVar24;
  uVar24 = (ulong)CARRY8(uVar30,uVar24);
  uVar30 = uVar29 + uVar26;
  uVar38 = uVar30 + uVar24;
  uVar36 = uVar27 + uVar35;
  uVar35 = (ulong)CARRY8(uVar27,uVar35);
  uVar27 = uVar38 + uVar35;
  uVar32 = (ulong)CARRY8(uVar37,uVar25) + (ulong)(CARRY8(uVar28,uVar33) || CARRY8(uVar32,uVar31)) +
           (ulong)(CARRY8(uVar29,uVar26) || CARRY8(uVar30,uVar24)) + (ulong)CARRY8(uVar38,uVar35);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar41;
  uVar24 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar8,8);
  uVar25 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar8,0);
  uVar35 = uVar27 + uVar25;
  uVar25 = (ulong)CARRY8(uVar27,uVar25);
  uVar31 = uVar32 + uVar24;
  uVar30 = uVar31 + uVar25;
  uVar29 = uVar35 + uVar40;
  uVar35 = (ulong)CARRY8(uVar35,uVar40);
  uVar40 = uVar30 + uVar35;
  uVar28 = uVar40 + uVar41;
  uVar33 = (ulong)(CARRY8(uVar32,uVar24) || CARRY8(uVar31,uVar25)) + (ulong)CARRY8(uVar30,uVar35) +
           (ulong)CARRY8(uVar40,uVar41);
  auVar21._8_8_ = uVar33;
  auVar21._0_8_ = uVar28;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = auVar17._0_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar29;
  auVar18 = ZEXT816(0x402da1732fc9bebf) * auVar9 + auVar18;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = auVar18._0_8_;
  uVar25 = auVar18._8_8_;
  uVar40 = uVar25 + uVar34;
  uVar25 = (ulong)CARRY8(uVar25,uVar34);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar28;
  uVar24 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar10,8);
  uVar35 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar10,0);
  uVar31 = uVar40 + uVar35;
  uVar35 = (ulong)CARRY8(uVar40,uVar35);
  uVar41 = uVar25 + uVar24;
  uVar30 = uVar41 + uVar35;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar29;
  uVar32 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar11,8);
  uVar40 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar11,0);
  uVar38 = uVar31 + uVar40;
  uVar40 = (ulong)CARRY8(uVar31,uVar40);
  uVar31 = uVar30 + uVar32;
  uVar27 = uVar31 + uVar40;
  uVar26 = (ulong)(CARRY8(uVar25,uVar24) || CARRY8(uVar41,uVar35)) +
           (ulong)(CARRY8(uVar30,uVar32) || CARRY8(uVar31,uVar40));
  uVar40 = uVar27 + uVar39;
  uVar25 = (ulong)CARRY8(uVar27,uVar39);
  uVar27 = uVar26 + uVar25;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar33;
  uVar32 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar12,8);
  uVar35 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar12,0);
  uVar41 = uVar40 + uVar35;
  uVar35 = (ulong)CARRY8(uVar40,uVar35);
  uVar31 = uVar27 + uVar32;
  uVar37 = uVar31 + uVar35;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar28;
  uVar30 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar13,8);
  uVar40 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar13,0);
  uVar34 = uVar41 + uVar40;
  uVar40 = (ulong)CARRY8(uVar41,uVar40);
  uVar24 = uVar37 + uVar30;
  uVar28 = uVar24 + uVar40;
  uVar39 = uVar34 + uVar29;
  uVar41 = (ulong)CARRY8(uVar34,uVar29);
  uVar29 = uVar28 + uVar41;
  auVar19._8_8_ =
       (ulong)CARRY8(uVar26,uVar25) + (ulong)(CARRY8(uVar27,uVar32) || CARRY8(uVar31,uVar35)) +
       (ulong)(CARRY8(uVar37,uVar30) || CARRY8(uVar24,uVar40)) + (ulong)CARRY8(uVar28,uVar41) +
       (ulong)CARRY8(uVar29,uVar36);
  auVar19._0_8_ = uVar29 + uVar36;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar33;
  auVar21 = ZEXT816(0x4551231950b75fc4) * auVar14 + auVar19 + auVar21;
  uVar35 = auVar21._0_8_;
  uVar40 = auVar21._8_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar40;
  auVar22 = ZEXT816(0x402da1732fc9bebf) * auVar15 + auVar22;
  uVar25 = auVar22._8_8_;
  r->d[0] = auVar22._0_8_;
  auVar20[8] = CARRY8(uVar25,uVar38);
  auVar20._0_8_ = uVar25 + uVar38;
  auVar20._9_7_ = 0;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar40;
  auVar20 = ZEXT816(0x4551231950b75fc4) * auVar16 + auVar20;
  uVar25 = auVar20._8_8_;
  r->d[1] = auVar20._0_8_;
  uVar41 = uVar25 + uVar40;
  uVar25 = (ulong)CARRY8(uVar25,uVar40) + (ulong)CARRY8(uVar41,uVar39);
  r->d[2] = uVar41 + uVar39;
  r->d[3] = uVar25 + uVar35;
  local_90 = (uint)CARRY8(uVar25,uVar35);
  iVar23 = secp256k1_scalar_check_overflow(r);
  secp256k1_scalar_reduce(r,local_90 + iVar23);
  return;
}

Assistant:

static void secp256k1_scalar_reduce_512(secp256k1_scalar *r, const uint64_t *l) {
#ifdef USE_ASM_X86_64
    /* Reduce 512 bits into 385. */
    uint64_t m0, m1, m2, m3, m4, m5, m6;
    uint64_t p0, p1, p2, p3, p4;
    uint64_t c;

    __asm__ __volatile__(
    /* Preload. */
    "movq 32(%%rsi), %%r11\n"
    "movq 40(%%rsi), %%r12\n"
    "movq 48(%%rsi), %%r13\n"
    "movq 56(%%rsi), %%r14\n"
    /* Initialize r8,r9,r10 */
    "movq 0(%%rsi), %%r8\n"
    "xorq %%r9, %%r9\n"
    "xorq %%r10, %%r10\n"
    /* (r8,r9) += n0 * c0 */
    "movq %8, %%rax\n"
    "mulq %%r11\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    /* extract m0 */
    "movq %%r8, %q0\n"
    "xorq %%r8, %%r8\n"
    /* (r9,r10) += l1 */
    "addq 8(%%rsi), %%r9\n"
    "adcq $0, %%r10\n"
    /* (r9,r10,r8) += n1 * c0 */
    "movq %8, %%rax\n"
    "mulq %%r12\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* (r9,r10,r8) += n0 * c1 */
    "movq %9, %%rax\n"
    "mulq %%r11\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* extract m1 */
    "movq %%r9, %q1\n"
    "xorq %%r9, %%r9\n"
    /* (r10,r8,r9) += l2 */
    "addq 16(%%rsi), %%r10\n"
    "adcq $0, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += n2 * c0 */
    "movq %8, %%rax\n"
    "mulq %%r13\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += n1 * c1 */
    "movq %9, %%rax\n"
    "mulq %%r12\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += n0 */
    "addq %%r11, %%r10\n"
    "adcq $0, %%r8\n"
    "adcq $0, %%r9\n"
    /* extract m2 */
    "movq %%r10, %q2\n"
    "xorq %%r10, %%r10\n"
    /* (r8,r9,r10) += l3 */
    "addq 24(%%rsi), %%r8\n"
    "adcq $0, %%r9\n"
    "adcq $0, %%r10\n"
    /* (r8,r9,r10) += n3 * c0 */
    "movq %8, %%rax\n"
    "mulq %%r14\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    "adcq $0, %%r10\n"
    /* (r8,r9,r10) += n2 * c1 */
    "movq %9, %%rax\n"
    "mulq %%r13\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    "adcq $0, %%r10\n"
    /* (r8,r9,r10) += n1 */
    "addq %%r12, %%r8\n"
    "adcq $0, %%r9\n"
    "adcq $0, %%r10\n"
    /* extract m3 */
    "movq %%r8, %q3\n"
    "xorq %%r8, %%r8\n"
    /* (r9,r10,r8) += n3 * c1 */
    "movq %9, %%rax\n"
    "mulq %%r14\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* (r9,r10,r8) += n2 */
    "addq %%r13, %%r9\n"
    "adcq $0, %%r10\n"
    "adcq $0, %%r8\n"
    /* extract m4 */
    "movq %%r9, %q4\n"
    /* (r10,r8) += n3 */
    "addq %%r14, %%r10\n"
    "adcq $0, %%r8\n"
    /* extract m5 */
    "movq %%r10, %q5\n"
    /* extract m6 */
    "movq %%r8, %q6\n"
    : "=&g"(m0), "=&g"(m1), "=&g"(m2), "=g"(m3), "=g"(m4), "=g"(m5), "=g"(m6)
    : "S"(l), "i"(SECP256K1_N_C_0), "i"(SECP256K1_N_C_1)
    : "rax", "rdx", "r8", "r9", "r10", "r11", "r12", "r13", "r14", "cc");

    /* Reduce 385 bits into 258. */
    __asm__ __volatile__(
    /* Preload */
    "movq %q9, %%r11\n"
    "movq %q10, %%r12\n"
    "movq %q11, %%r13\n"
    /* Initialize (r8,r9,r10) */
    "movq %q5, %%r8\n"
    "xorq %%r9, %%r9\n"
    "xorq %%r10, %%r10\n"
    /* (r8,r9) += m4 * c0 */
    "movq %12, %%rax\n"
    "mulq %%r11\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    /* extract p0 */
    "movq %%r8, %q0\n"
    "xorq %%r8, %%r8\n"
    /* (r9,r10) += m1 */
    "addq %q6, %%r9\n"
    "adcq $0, %%r10\n"
    /* (r9,r10,r8) += m5 * c0 */
    "movq %12, %%rax\n"
    "mulq %%r12\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* (r9,r10,r8) += m4 * c1 */
    "movq %13, %%rax\n"
    "mulq %%r11\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* extract p1 */
    "movq %%r9, %q1\n"
    "xorq %%r9, %%r9\n"
    /* (r10,r8,r9) += m2 */
    "addq %q7, %%r10\n"
    "adcq $0, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += m6 * c0 */
    "movq %12, %%rax\n"
    "mulq %%r13\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += m5 * c1 */
    "movq %13, %%rax\n"
    "mulq %%r12\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += m4 */
    "addq %%r11, %%r10\n"
    "adcq $0, %%r8\n"
    "adcq $0, %%r9\n"
    /* extract p2 */
    "movq %%r10, %q2\n"
    /* (r8,r9) += m3 */
    "addq %q8, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r8,r9) += m6 * c1 */
    "movq %13, %%rax\n"
    "mulq %%r13\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    /* (r8,r9) += m5 */
    "addq %%r12, %%r8\n"
    "adcq $0, %%r9\n"
    /* extract p3 */
    "movq %%r8, %q3\n"
    /* (r9) += m6 */
    "addq %%r13, %%r9\n"
    /* extract p4 */
    "movq %%r9, %q4\n"
    : "=&g"(p0), "=&g"(p1), "=&g"(p2), "=g"(p3), "=g"(p4)
    : "g"(m0), "g"(m1), "g"(m2), "g"(m3), "g"(m4), "g"(m5), "g"(m6), "i"(SECP256K1_N_C_0), "i"(SECP256K1_N_C_1)
    : "rax", "rdx", "r8", "r9", "r10", "r11", "r12", "r13", "cc");

    /* Reduce 258 bits into 256. */
    __asm__ __volatile__(
    /* Preload */
    "movq %q5, %%r10\n"
    /* (rax,rdx) = p4 * c0 */
    "movq %7, %%rax\n"
    "mulq %%r10\n"
    /* (rax,rdx) += p0 */
    "addq %q1, %%rax\n"
    "adcq $0, %%rdx\n"
    /* extract r0 */
    "movq %%rax, 0(%q6)\n"
    /* Move to (r8,r9) */
    "movq %%rdx, %%r8\n"
    "xorq %%r9, %%r9\n"
    /* (r8,r9) += p1 */
    "addq %q2, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r8,r9) += p4 * c1 */
    "movq %8, %%rax\n"
    "mulq %%r10\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    /* Extract r1 */
    "movq %%r8, 8(%q6)\n"
    "xorq %%r8, %%r8\n"
    /* (r9,r8) += p4 */
    "addq %%r10, %%r9\n"
    "adcq $0, %%r8\n"
    /* (r9,r8) += p2 */
    "addq %q3, %%r9\n"
    "adcq $0, %%r8\n"
    /* Extract r2 */
    "movq %%r9, 16(%q6)\n"
    "xorq %%r9, %%r9\n"
    /* (r8,r9) += p3 */
    "addq %q4, %%r8\n"
    "adcq $0, %%r9\n"
    /* Extract r3 */
    "movq %%r8, 24(%q6)\n"
    /* Extract c */
    "movq %%r9, %q0\n"
    : "=g"(c)
    : "g"(p0), "g"(p1), "g"(p2), "g"(p3), "g"(p4), "D"(r), "i"(SECP256K1_N_C_0), "i"(SECP256K1_N_C_1)
    : "rax", "rdx", "r8", "r9", "r10", "cc", "memory");
#else
    secp256k1_uint128 c128;
    uint64_t c, c0, c1, c2;
    uint64_t n0 = l[4], n1 = l[5], n2 = l[6], n3 = l[7];
    uint64_t m0, m1, m2, m3, m4, m5;
    uint32_t m6;
    uint64_t p0, p1, p2, p3;
    uint32_t p4;

    /* Reduce 512 bits into 385. */
    /* m[0..6] = l[0..3] + n[0..3] * SECP256K1_N_C. */
    c0 = l[0]; c1 = 0; c2 = 0;
    muladd_fast(n0, SECP256K1_N_C_0);
    extract_fast(m0);
    sumadd_fast(l[1]);
    muladd(n1, SECP256K1_N_C_0);
    muladd(n0, SECP256K1_N_C_1);
    extract(m1);
    sumadd(l[2]);
    muladd(n2, SECP256K1_N_C_0);
    muladd(n1, SECP256K1_N_C_1);
    sumadd(n0);
    extract(m2);
    sumadd(l[3]);
    muladd(n3, SECP256K1_N_C_0);
    muladd(n2, SECP256K1_N_C_1);
    sumadd(n1);
    extract(m3);
    muladd(n3, SECP256K1_N_C_1);
    sumadd(n2);
    extract(m4);
    sumadd_fast(n3);
    extract_fast(m5);
    VERIFY_CHECK(c0 <= 1);
    m6 = c0;

    /* Reduce 385 bits into 258. */
    /* p[0..4] = m[0..3] + m[4..6] * SECP256K1_N_C. */
    c0 = m0; c1 = 0; c2 = 0;
    muladd_fast(m4, SECP256K1_N_C_0);
    extract_fast(p0);
    sumadd_fast(m1);
    muladd(m5, SECP256K1_N_C_0);
    muladd(m4, SECP256K1_N_C_1);
    extract(p1);
    sumadd(m2);
    muladd(m6, SECP256K1_N_C_0);
    muladd(m5, SECP256K1_N_C_1);
    sumadd(m4);
    extract(p2);
    sumadd_fast(m3);
    muladd_fast(m6, SECP256K1_N_C_1);
    sumadd_fast(m5);
    extract_fast(p3);
    p4 = c0 + m6;
    VERIFY_CHECK(p4 <= 2);

    /* Reduce 258 bits into 256. */
    /* r[0..3] = p[0..3] + p[4] * SECP256K1_N_C. */
    secp256k1_u128_from_u64(&c128, p0);
    secp256k1_u128_accum_mul(&c128, SECP256K1_N_C_0, p4);
    r->d[0] = secp256k1_u128_to_u64(&c128); secp256k1_u128_rshift(&c128, 64);
    secp256k1_u128_accum_u64(&c128, p1);
    secp256k1_u128_accum_mul(&c128, SECP256K1_N_C_1, p4);
    r->d[1] = secp256k1_u128_to_u64(&c128); secp256k1_u128_rshift(&c128, 64);
    secp256k1_u128_accum_u64(&c128, p2);
    secp256k1_u128_accum_u64(&c128, p4);
    r->d[2] = secp256k1_u128_to_u64(&c128); secp256k1_u128_rshift(&c128, 64);
    secp256k1_u128_accum_u64(&c128, p3);
    r->d[3] = secp256k1_u128_to_u64(&c128);
    c = secp256k1_u128_hi_u64(&c128);
#endif

    /* Final reduction of r. */
    secp256k1_scalar_reduce(r, c + secp256k1_scalar_check_overflow(r));
}